

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_image(nk_context *ctx,nk_image img)

{
  nk_window *pnVar1;
  nk_widget_layout_states nVar2;
  nk_rect local_18;
  
  if (ctx != (nk_context *)0x0) {
    pnVar1 = ctx->current;
    if (((pnVar1 != (nk_window *)0x0) && (pnVar1->layout != (nk_panel *)0x0)) &&
       (nVar2 = nk_widget(&local_18,ctx), nVar2 != NK_WIDGET_INVALID)) {
      nk_draw_image(&pnVar1->buffer,local_18,&img,(nk_color)0xffffffff);
    }
  }
  return;
}

Assistant:

NK_API void
nk_image(struct nk_context *ctx, struct nk_image img)
{
struct nk_window *win;
struct nk_rect bounds;

NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
if (!ctx || !ctx->current || !ctx->current->layout) return;

win = ctx->current;
if (!nk_widget(&bounds, ctx)) return;
nk_draw_image(&win->buffer, bounds, &img, nk_white);
}